

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sftp.c
# Opt level: O1

_Bool fxp_got_attrs(sftp_packet *pktin,fxp_attrs *attrs)

{
  BinarySourceError BVar1;
  
  BinarySource_get_fxp_attrs(pktin->binarysource_,attrs);
  BVar1 = pktin->binarysource_[0].err;
  if (BVar1 != BSE_NO_ERROR) {
    fxp_error_message = "malformed SSH_FXP_ATTRS packet";
    fxp_errtype = -1;
  }
  sftp_pkt_free(pktin);
  return BVar1 == BSE_NO_ERROR;
}

Assistant:

static bool fxp_got_attrs(struct sftp_packet *pktin, struct fxp_attrs *attrs)
{
    get_fxp_attrs(pktin, attrs);
    if (get_err(pktin)) {
        fxp_internal_error("malformed SSH_FXP_ATTRS packet");
        sftp_pkt_free(pktin);
        return false;
    }
    sftp_pkt_free(pktin);
    return true;
}